

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int ns_hexdump(void *buf,int len,char *dst,int dst_len)

{
  undefined1 uVar1;
  int iVar2;
  int iVar3;
  int local_54;
  int n;
  int idx;
  int i;
  char ascii [17];
  uchar *p;
  int dst_len_local;
  char *dst_local;
  int len_local;
  void *buf_local;
  
  unique0x1000014d = buf;
  memset(&idx,0,0x11);
  local_54 = 0;
  for (n = 0; n < len; n = n + 1) {
    iVar3 = n % 0x10;
    if (iVar3 == 0) {
      if (0 < n) {
        iVar2 = snprintf(dst + local_54,(long)(dst_len - local_54),"  %s\n",&idx);
        local_54 = iVar2 + local_54;
      }
      iVar2 = snprintf(dst + local_54,(long)(dst_len - local_54),"%04x ",(ulong)(uint)n);
      local_54 = iVar2 + local_54;
    }
    iVar2 = snprintf(dst + local_54,(long)(dst_len - local_54)," %02x",
                     (ulong)*(byte *)((long)stack0xffffffffffffffd0 + (long)n));
    local_54 = iVar2 + local_54;
    if ((*(byte *)((long)stack0xffffffffffffffd0 + (long)n) < 0x20) ||
       (0x7e < *(byte *)((long)stack0xffffffffffffffd0 + (long)n))) {
      uVar1 = 0x2e;
    }
    else {
      uVar1 = *(undefined1 *)((long)stack0xffffffffffffffd0 + (long)n);
    }
    *(undefined1 *)((long)&idx + (long)iVar3) = uVar1;
    *(undefined1 *)((long)&idx + (long)(iVar3 + 1)) = 0;
  }
  while (n % 0x10 != 0) {
    iVar3 = snprintf(dst + local_54,(long)(dst_len - local_54),"%s","   ");
    local_54 = iVar3 + local_54;
    n = n + 1;
  }
  iVar3 = snprintf(dst + local_54,(long)(dst_len - local_54),"  %s\n\n",&idx);
  return iVar3 + local_54;
}

Assistant:

int ns_hexdump(const void *buf, int len, char *dst, int dst_len) {
  const unsigned char *p = (const unsigned char *) buf;
  char ascii[17] = "";
  int i, idx, n = 0;

  for (i = 0; i < len; i++) {
    idx = i % 16;
    if (idx == 0) {
      if (i > 0) n += snprintf(dst + n, dst_len - n, "  %s\n", ascii);
      n += snprintf(dst + n, dst_len - n, "%04x ", i);
    }
    n += snprintf(dst + n, dst_len - n, " %02x", p[i]);
    ascii[idx] = p[i] < 0x20 || p[i] > 0x7e ? '.' : p[i];
    ascii[idx + 1] = '\0';
  }

  while (i++ % 16) n += snprintf(dst + n, dst_len - n, "%s", "   ");
  n += snprintf(dst + n, dst_len - n, "  %s\n\n", ascii);

  return n;
}